

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void update_live(MIR_reg_t var,int out_p,bitmap_t live)

{
  bitmap_t live_local;
  int out_p_local;
  MIR_reg_t var_local;
  
  if (out_p == 0) {
    bitmap_set_bit_p(live,(ulong)var);
  }
  else {
    bitmap_clear_bit_p(live,(ulong)var);
  }
  return;
}

Assistant:

static void update_live (MIR_reg_t var, int out_p, bitmap_t live) {
  if (out_p) {
    bitmap_clear_bit_p (live, var);
  } else {
    bitmap_set_bit_p (live, var);
  }
}